

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O3

IString __thiscall wasm::Wasm2JSBuilder::getTemp(Wasm2JSBuilder *this,Type type,Function *func)

{
  key_type *__k;
  pointer *ppIVar1;
  key_type *__k_00;
  unordered_map<wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>_>_>
  *this_00;
  uint __val;
  bool bVar2;
  char cVar3;
  char cVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  undefined8 *puVar7;
  long *plVar8;
  IString *this_01;
  __node_base_ptr p_Var9;
  ulong *puVar10;
  long *plVar11;
  uint uVar12;
  ulong uVar13;
  undefined8 uVar14;
  ulong uVar15;
  Type in_R8;
  __hash_code __code;
  char *__code_00;
  string_view sVar16;
  Name name;
  string local_f8;
  ulong *local_d8;
  uintptr_t local_d0;
  ulong local_c8;
  long lStack_c0;
  ulong *local_b8;
  long local_b0;
  ulong local_a8 [2];
  long *local_98;
  undefined8 local_90;
  long local_88;
  undefined8 uStack_80;
  string_view local_78;
  long local_68;
  undefined8 uStack_60;
  size_type *local_58;
  string __str;
  Type type_local;
  
  __str.field_2._8_8_ = type.id;
  if ((type.id & 1) != 0 && 6 < type.id) {
    __assert_fail("!type.isTuple() && \"Unexpected tuple type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm2js.h"
                  ,0xd3,"IString wasm::Wasm2JSBuilder::getTemp(Type, Function *)");
  }
  this_00 = &this->frees;
  pmVar5 = std::__detail::
           _Map_base<wasm::Type,_std::pair<const_wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<wasm::Type,_std::pair<const_wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_00,(key_type *)((long)&__str.field_2 + 8));
  if ((pmVar5->super__Vector_base<wasm::IString,_std::allocator<wasm::IString>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (pmVar5->super__Vector_base<wasm::IString,_std::allocator<wasm::IString>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    __k = (key_type *)((long)&__str.field_2 + 8);
    pmVar5 = std::__detail::
             _Map_base<wasm::Type,_std::pair<const_wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<wasm::Type,_std::pair<const_wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_00,__k);
    sVar16 = (pmVar5->super__Vector_base<wasm::IString,_std::allocator<wasm::IString>_>)._M_impl.
             super__Vector_impl_data._M_finish[-1].str;
    pmVar5 = std::__detail::
             _Map_base<wasm::Type,_std::pair<const_wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<wasm::Type,_std::pair<const_wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_00,__k);
    ppIVar1 = &(pmVar5->super__Vector_base<wasm::IString,_std::allocator<wasm::IString>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppIVar1 = *ppIVar1 + -1;
    goto LAB_00d095da;
  }
  __k_00 = (key_type *)((long)&__str.field_2 + 8);
  pmVar6 = std::__detail::
           _Map_base<wasm::Type,_std::pair<const_wasm::Type,_unsigned_int>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<wasm::Type,_std::pair<const_wasm::Type,_unsigned_int>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->temps,__k_00);
  __val = *pmVar6;
  *pmVar6 = __val + 1;
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"wasm2js_","");
  wasm::Type::toString_abi_cxx11_(&local_f8,__k_00);
  uVar13 = 0xf;
  if (local_b8 != local_a8) {
    uVar13 = local_a8[0];
  }
  if (uVar13 < local_f8._M_string_length + local_b0) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      uVar14 = local_f8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_f8._M_string_length + local_b0) goto LAB_00d09319;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,(ulong)local_b8);
  }
  else {
LAB_00d09319:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_f8._M_dataplus._M_p);
  }
  local_98 = &local_88;
  plVar8 = puVar7 + 2;
  if ((long *)*puVar7 == plVar8) {
    local_88 = *plVar8;
    uStack_80 = puVar7[3];
  }
  else {
    local_88 = *plVar8;
    local_98 = (long *)*puVar7;
  }
  local_90 = puVar7[1];
  *puVar7 = plVar8;
  puVar7[1] = 0;
  *(undefined1 *)plVar8 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_98);
  puVar10 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar10) {
    local_c8 = *puVar10;
    lStack_c0 = plVar8[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *puVar10;
    local_d8 = (ulong *)*plVar8;
  }
  local_d0 = plVar8[1];
  *plVar8 = (long)puVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  cVar4 = '\x01';
  if (9 < __val) {
    uVar12 = __val;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar12 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_00d09432;
      }
      if (uVar12 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_00d09432;
      }
      if (uVar12 < 10000) goto LAB_00d09432;
      bVar2 = 99999 < uVar12;
      uVar12 = uVar12 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar2);
    cVar4 = cVar4 + '\x01';
  }
LAB_00d09432:
  local_58 = &__str._M_string_length;
  std::__cxx11::string::_M_construct((ulong)&local_58,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)local_58,(uint)__str._M_dataplus._M_p,__val);
  uVar13 = CONCAT44(__str._M_dataplus._M_p._4_4_,(uint)__str._M_dataplus._M_p) + local_d0;
  uVar15 = 0xf;
  if (local_d8 != &local_c8) {
    uVar15 = local_c8;
  }
  in_R8.id = local_d0;
  if (uVar15 < uVar13) {
    uVar15 = 0xf;
    if (local_58 != &__str._M_string_length) {
      uVar15 = __str._M_string_length;
    }
    if (uVar15 < uVar13) goto LAB_00d0949d;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,(ulong)local_d8);
  }
  else {
LAB_00d0949d:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_58);
  }
  plVar8 = &local_68;
  plVar11 = puVar7 + 2;
  if ((long *)*puVar7 == plVar11) {
    local_68 = *plVar11;
    uStack_60 = puVar7[3];
  }
  else {
    local_68 = *plVar11;
    plVar8 = (long *)*puVar7;
  }
  local_78._M_str = (char *)puVar7[1];
  local_78._M_len = (size_t)plVar8;
  *puVar7 = plVar11;
  puVar7[1] = 0;
  *(char *)plVar11 = '\0';
  this_01 = (IString *)strlen((char *)plVar8);
  sVar16._M_str = (char *)0x0;
  sVar16._M_len = (size_t)plVar8;
  sVar16 = IString::interned(this_01,sVar16,SUB81(plVar11,0));
  if ((long *)local_78._M_len != &local_68) {
    operator_delete((void *)local_78._M_len,local_68 + 1);
  }
  if (local_58 != &__str._M_string_length) {
    operator_delete(local_58,__str._M_string_length + 1);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,local_c8 + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8,local_a8[0] + 1);
  }
  sVar16 = (string_view)fromName(this,(Name)sVar16,Local);
LAB_00d095da:
  __code_00 = sVar16._M_str;
  local_78 = sVar16;
  p_Var9 = std::
           _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node
                     (&(func->localIndices)._M_h,
                      (ulong)__code_00 % (func->localIndices)._M_h._M_bucket_count,
                      (key_type *)&local_78,(__hash_code)__code_00);
  if ((p_Var9 == (__node_base_ptr)0x0) || (p_Var9->_M_nxt == (_Hash_node_base *)0x0)) {
    name.super_IString.str._M_str = (char *)__str.field_2._8_8_;
    name.super_IString.str._M_len = (size_t)__code_00;
    Builder::addVar((Builder *)func,(Function *)sVar16._M_len,name,in_R8);
  }
  return (IString)sVar16;
}

Assistant:

IString getTemp(Type type, Function* func) {
    IString ret;
    // TODO: handle tuples
    assert(!type.isTuple() && "Unexpected tuple type");
    if (frees[type].size() > 0) {
      ret = frees[type].back();
      frees[type].pop_back();
    } else {
      auto index = temps[type]++;
      ret = IString((std::string("wasm2js_") + type.toString() + "$" +
                     std::to_string(index))
                      .c_str(),
                    false);
      ret = fromName(ret, NameScope::Local);
    }
    if (func->localIndices.find(ret) == func->localIndices.end()) {
      Builder::addVar(func, ret, type);
    }
    return ret;
  }